

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_last_ip.c
# Opt level: O0

int pt_last_ip_query(uint64_t *ip,pt_last_ip *last_ip)

{
  pt_last_ip *last_ip_local;
  uint64_t *ip_local;
  
  if (last_ip == (pt_last_ip *)0x0) {
    ip_local._4_4_ = -1;
  }
  else if ((last_ip->field_0x8 & 1) == 0) {
    if (ip != (uint64_t *)0x0) {
      *ip = 0;
    }
    ip_local._4_4_ = -0xb;
  }
  else if (((byte)last_ip->field_0x8 >> 1 & 1) == 0) {
    if (ip != (uint64_t *)0x0) {
      *ip = last_ip->ip;
    }
    ip_local._4_4_ = 0;
  }
  else {
    if (ip != (uint64_t *)0x0) {
      *ip = 0;
    }
    ip_local._4_4_ = -0xc;
  }
  return ip_local._4_4_;
}

Assistant:

int pt_last_ip_query(uint64_t *ip, const struct pt_last_ip *last_ip)
{
	if (!last_ip)
		return -pte_internal;

	if (!last_ip->have_ip) {
		if (ip)
			*ip = 0ull;
		return -pte_noip;
	}

	if (last_ip->suppressed) {
		if (ip)
			*ip = 0ull;
		return -pte_ip_suppressed;
	}

	if (ip)
		*ip = last_ip->ip;

	return 0;
}